

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_52dd::Indent::Indent(Indent *this,string *current)

{
  this->m_indent = current;
  std::__cxx11::string::string((string *)&this->m_save,(string *)current);
  std::__cxx11::string::append((char *)this->m_indent);
  return;
}

Assistant:

Indent(string& current)
            : m_indent(current), m_save(current)
        { m_indent += "  "; }